

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O0

int mem_resize(jas_stream_memobj_t *m,size_t bufsize)

{
  int iVar1;
  uchar *puVar2;
  uchar *buf;
  size_t bufsize_local;
  jas_stream_memobj_t *m_local;
  
  iVar1 = jas_getdbglevel();
  if (99 < iVar1) {
    jas_eprintf("mem_resize(%p, %zu)\n",m,bufsize);
  }
  if (bufsize == 0) {
    jas_eprintf(
               "mem_resize was not really designed to handle a buffer of size 0\nThis may not work.\n"
               );
  }
  puVar2 = (uchar *)jas_realloc2(m->buf_,bufsize,1);
  if ((puVar2 == (uchar *)0x0) && (bufsize != 0)) {
    iVar1 = jas_getdbglevel();
    if (99 < iVar1) {
      jas_eprintf("mem_resize realloc failed\n");
    }
    m_local._4_4_ = -1;
  }
  else {
    iVar1 = jas_getdbglevel();
    if (99 < iVar1) {
      jas_eprintf("mem_resize realloc succeeded\n");
    }
    m->buf_ = puVar2;
    m->bufsize_ = bufsize;
    m_local._4_4_ = 0;
  }
  return m_local._4_4_;
}

Assistant:

static int mem_resize(jas_stream_memobj_t *m, size_t bufsize)
{
	unsigned char *buf;

	//assert(m->buf_);

	JAS_DBGLOG(100, ("mem_resize(%p, %zu)\n", m, bufsize));
	if (!bufsize) {
		jas_eprintf(
		  "mem_resize was not really designed to handle a buffer of size 0\n"
		  "This may not work.\n"
		);
	}

	if (!(buf = jas_realloc2(m->buf_, bufsize, sizeof(unsigned char))) &&
	  bufsize) {
		JAS_DBGLOG(100, ("mem_resize realloc failed\n"));
		return -1;
	}
	JAS_DBGLOG(100, ("mem_resize realloc succeeded\n"));
	m->buf_ = buf;
	m->bufsize_ = bufsize;
	return 0;
}